

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

ssize_t asl::Xdl::read(int __fd,void *__buf,size_t __nbytes)

{
  longlong t;
  ulong uVar1;
  ssize_t sVar2;
  ulong __nbytes_00;
  int iVar3;
  uint uVar4;
  undefined4 in_register_0000003c;
  XdlParser *this;
  byte bom [3];
  Array<char> buffer;
  TextFile tfile;
  XdlParser parser;
  
  this = (XdlParser *)CONCAT44(in_register_0000003c,__fd);
  XdlParser::XdlParser(&parser);
  TextFile::TextFile(&tfile,(String *)__buf,READ);
  if (tfile.super_File._file != (FILE *)0x0) {
    uVar1 = File::size(&tfile.super_File);
    if (0 < (long)uVar1) {
      __nbytes_00 = 100000;
      if (uVar1 < 100000) {
        __nbytes_00 = uVar1;
      }
      uVar4 = 0x3ffe;
      if ((uint)__nbytes_00 < 0x3ffe) {
        uVar4 = (uint)__nbytes_00;
      }
      Array<char>::alloc(&buffer,uVar4 + 1);
      sVar2 = File::read(&tfile.super_File,(int)bom,(void *)0x3,__nbytes_00);
      if (((int)sVar2 == 3) && (((bom[0] != 0xef || (bom[1] != 0xbb)) || (bom[2] != 0xbf)))) {
        File::seek(&tfile.super_File,0,START);
      }
      iVar3 = *(int *)(buffer._a + -0x10);
      do {
        sVar2 = File::read(&tfile.super_File,(int)buffer._a,(void *)(ulong)(iVar3 - 1),__nbytes_00);
        __nbytes_00 = (ulong)(int)sVar2;
        buffer._a[__nbytes_00] = '\0';
        XdlParser::parse(&parser,buffer._a);
        iVar3 = *(int *)(buffer._a + -0x10);
      } while (iVar3 + -1 <= (int)sVar2);
      XdlParser::parse(&parser," ");
      XdlParser::value(this);
      Array<char>::~Array(&buffer);
      goto LAB_0012e085;
    }
  }
  *(undefined4 *)&this->_vptr_XdlParser = 0;
  this->_state = '\0';
  this->_prevState = '\0';
  *(undefined6 *)&this->field_0xa = 0;
LAB_0012e085:
  File::~File(&tfile.super_File);
  XdlParser::~XdlParser(&parser);
  return (ssize_t)this;
}

Assistant:

Var Xdl::read(const String& file)
{
	XdlParser parser;
	TextFile tfile(file, File::READ);
	if (!tfile)
		return Var();
	int size = int(clamp(tfile.size(), 0ll, 100000ll));
	if (size == 0)
		return Var();
	Array<char> buffer(min(16382, size) + 1);
	byte bom[3];
	if(tfile.read(bom, 3) == 3 && !(bom[0] == 0xef && bom[1] == 0xbb && bom[2] == 0xbf))
		tfile.seek(0);
	while (1)
	{
		int n = tfile.read(buffer.data(), buffer.length() - 1);
		buffer[n] = '\0';
		parser.parse(buffer.data());
		if (n < buffer.length() - 1)
			break;
	}
	parser.parse(" ");
	return parser.value();
}